

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetPropertyName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  __type _Var1;
  bool bVar2;
  Descriptor *this_00;
  string *__rhs;
  string local_40;
  undefined1 local_19;
  csharp *local_18;
  FieldDescriptor *descriptor_local;
  string *property_name;
  
  local_19 = 0;
  local_18 = this;
  descriptor_local = (FieldDescriptor *)__return_storage_ptr__;
  GetFieldName_abi_cxx11_(&local_40,this,descriptor);
  UnderscoresToPascalCase(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = FieldDescriptor::containing_type((FieldDescriptor *)local_18);
  __rhs = Descriptor::name_abi_cxx11_(this_00);
  _Var1 = std::operator==(__return_storage_ptr__,__rhs);
  if (((_Var1) || (bVar2 = std::operator==(__return_storage_ptr__,"Types"), bVar2)) ||
     (bVar2 = std::operator==(__return_storage_ptr__,"Descriptor"), bVar2)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetPropertyName(const FieldDescriptor* descriptor) {
  // TODO(jtattermusch): consider introducing csharp_property_name field option
  std::string property_name = UnderscoresToPascalCase(GetFieldName(descriptor));
  // Avoid either our own type name or reserved names. Note that not all names
  // are reserved - a field called to_string, write_to etc would still cause a problem.
  // There are various ways of ending up with naming collisions, but we try to avoid obvious
  // ones.
  if (property_name == descriptor->containing_type()->name()
      || property_name == "Types"
      || property_name == "Descriptor") {
    property_name += "_";
  }
  return property_name;
}